

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void jtransform_execute_transform
               (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
               jpeg_transform_info *info)

{
  int iVar1;
  J_DCT_METHOD JVar2;
  int iVar3;
  jvirt_barray_ptr *dst_coef_arrays_00;
  j_decompress_ptr in_RCX;
  j_compress_ptr in_RDX;
  j_decompress_ptr in_RSI;
  j_compress_ptr in_RDI;
  JDIMENSION unaff_retaddr;
  JDIMENSION unaff_retaddr_00;
  j_compress_ptr in_stack_00000008;
  JDIMENSION in_stack_00000010;
  JDIMENSION in_stack_00000014;
  JDIMENSION in_stack_00000018;
  undefined4 in_stack_0000001c;
  JDIMENSION in_stack_00000020;
  JDIMENSION in_stack_00000024;
  j_compress_ptr in_stack_00000028;
  jvirt_barray_ptr *dst_coef_arrays;
  jvirt_barray_ptr *src_coef_arrays_00;
  JDIMENSION JVar4;
  
  src_coef_arrays_00 = (jvirt_barray_ptr *)in_RCX->output_gamma;
  dst_coef_arrays_00 = (jvirt_barray_ptr *)(ulong)*(uint *)&in_RCX->err;
  JVar4 = (JDIMENSION)((ulong)in_RSI >> 0x20);
  switch(dst_coef_arrays_00) {
  case (jvirt_barray_ptr *)0x0:
    if ((*(uint *)(in_RDI->dc_huff_tbl_ptrs + 1) < (uint)in_RCX->buffered_image) ||
       (*(uint *)((long)in_RDI->dc_huff_tbl_ptrs + 0xc) < (uint)in_RCX->raw_data_out)) {
      if ((*(uint *)(in_RDI->dc_huff_tbl_ptrs + 1) < (uint)in_RCX->buffered_image) &&
         (*(int *)((long)&in_RCX->client_data + 4) == 4)) {
        do_crop_ext_reflect((j_decompress_ptr)dst_coef_arrays,in_stack_00000028,in_stack_00000024,
                            in_stack_00000020,
                            (jvirt_barray_ptr *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                            (jvirt_barray_ptr *)CONCAT44(in_stack_00000014,in_stack_00000010));
      }
      else if ((*(uint *)(in_RDI->dc_huff_tbl_ptrs + 1) < (uint)in_RCX->buffered_image) &&
              (*(int *)((long)&in_RCX->client_data + 4) == 3)) {
        do_crop_ext_flat((j_decompress_ptr)CONCAT44(in_stack_00000014,in_stack_00000010),
                         in_stack_00000008,unaff_retaddr_00,unaff_retaddr,(jvirt_barray_ptr *)in_RDI
                         ,(jvirt_barray_ptr *)in_RSI);
      }
      else {
        do_crop_ext_zero((j_decompress_ptr)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,JVar4,
                         (JDIMENSION)in_RSI,(jvirt_barray_ptr *)in_RDX,(jvirt_barray_ptr *)in_RCX);
      }
    }
    else if ((in_RCX->dct_method != JDCT_ISLOW) || (in_RCX->do_fancy_upsampling != 0)) {
      do_crop(in_RSI,in_RDX,(JDIMENSION)((ulong)in_RCX >> 0x20),(JDIMENSION)in_RCX,
              src_coef_arrays_00,dst_coef_arrays_00);
    }
    break;
  case (jvirt_barray_ptr *)0x1:
    if ((in_RCX->do_fancy_upsampling == 0) && (*(int *)((long)&in_RCX->progress + 4) == 0)) {
      do_flip_h_no_crop((j_decompress_ptr)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,JVar4,
                        (jvirt_barray_ptr *)in_RDX);
    }
    else {
      do_flip_h((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
                (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                in_stack_00000010,(jvirt_barray_ptr *)in_stack_00000008,
                (jvirt_barray_ptr *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
    break;
  case (jvirt_barray_ptr *)0x2:
    do_flip_v((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
              (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
              in_stack_00000010,(jvirt_barray_ptr *)in_stack_00000008,
              (jvirt_barray_ptr *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  case (jvirt_barray_ptr *)0x3:
    do_transpose((j_decompress_ptr)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                 unaff_retaddr_00,unaff_retaddr,(jvirt_barray_ptr *)in_RDI,
                 (jvirt_barray_ptr *)in_RSI);
    break;
  case (jvirt_barray_ptr *)0x4:
    do_transverse((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
                  (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                  in_stack_00000010,(jvirt_barray_ptr *)in_stack_00000008,
                  (jvirt_barray_ptr *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  case (jvirt_barray_ptr *)0x5:
    do_rot_90((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
              (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
              in_stack_00000010,(jvirt_barray_ptr *)in_stack_00000008,
              (jvirt_barray_ptr *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  case (jvirt_barray_ptr *)0x6:
    do_rot_180((j_decompress_ptr)dst_coef_arrays,in_stack_00000028,in_stack_00000024,
               in_stack_00000020,(jvirt_barray_ptr *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               (jvirt_barray_ptr *)CONCAT44(in_stack_00000014,in_stack_00000010));
    break;
  case (jvirt_barray_ptr *)0x7:
    do_rot_270((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
               (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
               in_stack_00000010,(jvirt_barray_ptr *)in_stack_00000008,
               (jvirt_barray_ptr *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    break;
  case (jvirt_barray_ptr *)0x8:
    if ((((*(int *)((long)&in_RCX->client_data + 4) == 4) && (in_RCX->do_fancy_upsampling == 0)) &&
        (iVar1 = in_RCX->quantize_colors,
        iVar3 = jdiv_round_up(in_RCX->raw_data_out,(long)in_RCX->two_pass_quantize), iVar1 == iVar3)
        ) && ((in_RCX->dct_method == JDCT_ISLOW ||
              (JVar2 = in_RCX->dct_method, iVar1 = in_RCX->do_block_smoothing,
              iVar3 = jdiv_round_up(in_RCX->buffered_image,(long)(int)in_RCX->dither_mode),
              JVar2 + iVar1 == iVar3)))) {
      do_reflect((j_decompress_ptr)CONCAT44(in_stack_00000024,in_stack_00000020),
                 (j_compress_ptr)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                 (jvirt_barray_ptr *)in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    }
    else {
      JVar4 = (JDIMENSION)((ulong)in_RCX >> 0x20);
      if (*(int *)((long)&in_RCX->client_data + 4) == 3) {
        do_flatten((j_decompress_ptr)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
                   (JDIMENSION)((ulong)in_RSI >> 0x20),(JDIMENSION)in_RSI,(jvirt_barray_ptr *)in_RDX
                   ,JVar4,in_stack_00000010);
      }
      else {
        do_wipe(in_RSI,in_RDX,JVar4,(JDIMENSION)in_RCX,src_coef_arrays_00,
                (JDIMENSION)((ulong)dst_coef_arrays_00 >> 0x20),unaff_retaddr);
      }
    }
    break;
  case (jvirt_barray_ptr *)0x9:
    if ((in_RCX->do_block_smoothing != 0) && (in_RCX->quantize_colors != 0)) {
      do_drop((j_decompress_ptr)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,JVar4,
              (JDIMENSION)in_RSI,(jvirt_barray_ptr *)in_RDX,in_RCX,
              (jvirt_barray_ptr *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018,
              in_stack_00000020);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jtransform_execute_transform(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *dst_coef_arrays = info->workspace_coef_arrays;

  /* Note: conditions tested here should match those in switch statement
   * in jtransform_request_workspace()
   */
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height) {
      if (info->output_width > srcinfo->output_width &&
          info->crop_width_set == JCROP_REFLECT)
        do_crop_ext_reflect(srcinfo, dstinfo,
                            info->x_crop_offset, info->y_crop_offset,
                            src_coef_arrays, dst_coef_arrays);
      else if (info->output_width > srcinfo->output_width &&
               info->crop_width_set == JCROP_FORCE)
        do_crop_ext_flat(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
      else
        do_crop_ext_zero(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
    } else if (info->x_crop_offset != 0 || info->y_crop_offset != 0)
      do_crop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_FLIP_H:
    if (info->y_crop_offset != 0 || info->slow_hflip)
      do_flip_h(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                src_coef_arrays, dst_coef_arrays);
    else
      do_flip_h_no_crop(srcinfo, dstinfo, info->x_crop_offset,
                        src_coef_arrays);
    break;
  case JXFORM_FLIP_V:
    do_flip_v(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSPOSE:
    do_transpose(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSVERSE:
    do_transverse(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                  src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_90:
    do_rot_90(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_180:
    do_rot_180(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_270:
    do_rot_270(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_WIPE:
    if (info->crop_width_set == JCROP_REFLECT &&
        info->y_crop_offset == 0 && info->drop_height ==
        (JDIMENSION)jdiv_round_up
          ((long)info->output_height, (long)info->iMCU_sample_height) &&
        (info->x_crop_offset == 0 ||
         info->x_crop_offset + info->drop_width ==
         (JDIMENSION)jdiv_round_up
           ((long)info->output_width, (long)info->iMCU_sample_width)))
      do_reflect(srcinfo, dstinfo, info->x_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else if (info->crop_width_set == JCROP_FORCE)
      do_flatten(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else
      do_wipe(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_width, info->drop_height);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      do_drop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_ptr, info->drop_coef_arrays,
              info->drop_width, info->drop_height);
    break;
  }
}